

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::AddWarning(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *this,string *key,string *msg,bool replace)

{
  Env *pEVar1;
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  string *msg_00;
  string *key_00;
  BasicSolver *in_stack_ffffffffffffff90;
  string local_60;
  string local_40;
  byte local_19;
  
  local_19 = in_CL & 1;
  pEVar1 = EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x270));
  msg_00 = &local_40;
  std::__cxx11::string::string((string *)msg_00,in_RSI);
  key_00 = &local_60;
  std::__cxx11::string::string((string *)key_00,in_RDX);
  BasicSolver::AddWarning(in_stack_ffffffffffffff90,key_00,msg_00,SUB81((ulong)pEVar1 >> 0x38,0));
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void AddWarning(
      std::string key, std::string msg, bool replace=false) {
    GetEnv().AddWarning(
          std::move(key), std::move(msg), replace);
  }